

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O3

json __thiscall TestServerConnector::VerifyBatchResponse_abi_cxx11_(TestServerConnector *this)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  json_value extraout_RDX;
  long in_RSI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  json jVar3;
  ResultBuilder DOCTEST_RB;
  ExpressionDecomposer local_ec;
  Result local_e8;
  _Any_data local_c8;
  code *local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  ResultBuilder local_a0;
  
  local_b8 = (code *)0x0;
  uStack_b0 = 0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (in_RSI + 8),(parser_callback_t *)&local_c8,true,false);
  if (local_b8 != (code *)0x0) {
    (*local_b8)(&local_c8,&local_c8,__destroy_functor);
  }
  doctest::String::String((String *)&local_e8,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&local_a0,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x22,"result.is_array()","",(String *)&local_e8);
  doctest::String::~String((String *)&local_e8);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_ec,DT_REQUIRE);
  local_a8 = (ulong)(*(char *)&this->handler == '\x02') | (ulong)local_ec.m_at << 0x20;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_e8,(Expression_lhs *)&local_a8);
  doctest::detail::ResultBuilder::setResult(&local_a0,&local_e8);
  doctest::String::~String(&local_e8.m_decomp);
  dVar2 = doctest::detail::ResultBuilder::log
                    (&local_a0,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    jVar3 = (json)(*pcVar1)(SUB84(dVar2,0));
    return jVar3;
  }
  doctest::detail::ResultBuilder::react(&local_a0);
  doctest::String::~String((String *)&local_a0.super_AssertData.m_exception_string);
  doctest::String::~String(&local_a0.super_AssertData.m_decomp);
  doctest::String::~String(&local_a0.super_AssertData.m_exception);
  jVar3.m_value.object = extraout_RDX.object;
  jVar3._0_8_ = this;
  return jVar3;
}

Assistant:

json VerifyBatchResponse() {
        json result = json::parse(raw_response);
        REQUIRE(result.is_array());
        return result;
    }